

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_test.cpp
# Opt level: O0

int __thiscall ot::commissioner::MockSocket::Send(MockSocket *this,uint8_t *aBuf,size_t aLen)

{
  bool bVar1;
  element_type *peVar2;
  ByteArray *this_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  const_iterator local_30;
  ByteArray *local_28;
  ByteArray *peerRecvBuf;
  size_t aLen_local;
  uint8_t *aBuf_local;
  MockSocket *this_local;
  
  peerRecvBuf = (ByteArray *)aLen;
  aLen_local = (size_t)aBuf;
  aBuf_local = (uint8_t *)this;
  bVar1 = Socket::IsConnected(&this->super_Socket);
  if (!bVar1) {
    abort();
  }
  peVar2 = std::
           __shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mPeerSocket);
  this_00 = &peVar2->mRecvBuf;
  local_28 = this_00;
  local_38._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(this_00);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_30,&local_38);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,local_30,
             (uchar *)aLen_local,
             (uchar *)((long)&(peerRecvBuf->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start + aLen_local));
  peVar2 = std::
           __shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mPeerSocket);
  event_active(&(peVar2->super_Socket).mEvent,2,0);
  return (int)peerRecvBuf;
}

Assistant:

int MockSocket::Send(const uint8_t *aBuf, size_t aLen)
{
    VerifyOrDie(IsConnected());

    auto &peerRecvBuf = mPeerSocket->mRecvBuf;

    peerRecvBuf.insert(peerRecvBuf.end(), aBuf, aBuf + aLen);
    event_active(&mPeerSocket->mEvent, EV_READ, 0);

    return static_cast<int>(aLen);
}